

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

AssertionResult __thiscall
testing::internal::
CmpHelperEQ<std::vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>>,std::vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>>>
          (internal *this,char *lhs_expression,char *rhs_expression,
          vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *lhs,
          vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *rhs)

{
  pointer paVar1;
  int iVar2;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar3
  ;
  pointer __s1;
  pointer __s2;
  bool bVar4;
  AssertionResult AVar5;
  
  __s1 = (lhs->super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
         _M_impl.super__Vector_impl_data._M_start;
  paVar1 = (lhs->super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
  __s2 = (rhs->super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
         _M_impl.super__Vector_impl_data._M_start;
  if ((long)paVar1 - (long)__s1 ==
      (long)(rhs->super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)__s2) {
    bVar4 = __s1 == paVar1;
    if (bVar4) {
LAB_00111a54:
      if (bVar4) {
        AVar5 = AssertionSuccess();
        sVar3 = AVar5.message_.ptr_;
        goto LAB_00111a7a;
      }
    }
    else {
      iVar2 = bcmp(__s1,__s2,0x28);
      while (iVar2 == 0) {
        __s2 = __s2 + 1;
        __s1 = __s1 + 1;
        bVar4 = __s1 == paVar1;
        if (bVar4) goto LAB_00111a54;
        iVar2 = bcmp(__s1,__s2,0x28);
      }
    }
  }
  AVar5 = CmpHelperEQFailure<std::vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>>,std::vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>>>
                    (this,lhs_expression,rhs_expression,lhs,rhs);
  sVar3 = AVar5.message_.ptr_;
LAB_00111a7a:
  AVar5.message_.ptr_ = sVar3.ptr_;
  AVar5._0_8_ = this;
  return AVar5;
}

Assistant:

AssertionResult CmpHelperEQ(const char* lhs_expression,
                            const char* rhs_expression,
                            const T1& lhs,
                            const T2& rhs) {
  if (lhs == rhs) {
    return AssertionSuccess();
  }

  return CmpHelperEQFailure(lhs_expression, rhs_expression, lhs, rhs);
}